

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O3

int htmlNodeDump(xmlBufferPtr buf,xmlDocPtr doc,xmlNodePtr cur)

{
  xmlBufPtr buf_00;
  xmlOutputBufferPtr buf_01;
  size_t sVar1;
  size_t sVar2;
  undefined8 in_RCX;
  char *encoding;
  int iVar3;
  
  encoding = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),
                              cur == (xmlNodePtr)0x0 || buf == (xmlBufferPtr)0x0);
  if (cur != (xmlNodePtr)0x0 && buf != (xmlBufferPtr)0x0) {
    xmlInitParser();
    buf_00 = xmlBufFromBuffer(buf);
    if (buf_00 != (xmlBufPtr)0x0) {
      buf_01 = (xmlOutputBufferPtr)(*xmlMalloc)(0x38);
      if (buf_01 == (xmlOutputBufferPtr)0x0) {
        __xmlSimpleError(7,2,(xmlNodePtr)0x0,(char *)0x0,"allocating HTML output buffer");
        xmlBufBackToBuffer(buf_00);
      }
      else {
        buf_01->conv = (xmlBufPtr)0x0;
        buf_01->written = 0;
        buf_01->error = 0;
        buf_01->buffer = buf_00;
        buf_01->context = (void *)0x0;
        buf_01->writecallback = (xmlOutputWriteCallback)0x0;
        buf_01->closecallback = (xmlOutputCloseCallback)0x0;
        buf_01->encoder = (xmlCharEncodingHandlerPtr)0x0;
        sVar1 = xmlBufUse(buf_00);
        htmlNodeDumpFormatOutput(buf_01,doc,cur,encoding,1);
        (*xmlFree)(buf_01);
        sVar2 = xmlBufUse(buf_00);
        xmlBufBackToBuffer(buf_00);
        iVar3 = (int)sVar2 - (int)sVar1;
        if (-1 < iVar3) {
          return iVar3;
        }
      }
    }
  }
  return -1;
}

Assistant:

int
htmlNodeDump(xmlBufferPtr buf, xmlDocPtr doc, xmlNodePtr cur) {
    xmlBufPtr buffer;
    size_t ret;

    if ((buf == NULL) || (cur == NULL))
        return(-1);

    xmlInitParser();
    buffer = xmlBufFromBuffer(buf);
    if (buffer == NULL)
        return(-1);

    ret = htmlBufNodeDumpFormat(buffer, doc, cur, 1);

    xmlBufBackToBuffer(buffer);

    if (ret > INT_MAX)
        return(-1);
    return((int) ret);
}